

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O0

void __thiscall cmProcess::OnAllocate(cmProcess *this,size_t param_1,uv_buf_t *buf)

{
  size_type sVar1;
  char *base;
  uv_buf_t uVar2;
  char *local_30;
  size_t local_28;
  uv_buf_t *buf_local;
  size_t param_1_local;
  cmProcess *this_local;
  
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->Buf);
  if (sVar1 != 0x10000) {
    std::vector<char,_std::allocator<char>_>::resize(&this->Buf,0x10000);
  }
  base = std::vector<char,_std::allocator<char>_>::data(&this->Buf);
  sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->Buf);
  uVar2 = uv_buf_init(base,(uint)sVar1);
  local_30 = uVar2.base;
  buf->base = local_30;
  local_28 = uVar2.len;
  buf->len = local_28;
  return;
}

Assistant:

void cmProcess::OnAllocate(size_t /*suggested_size*/, uv_buf_t* buf)
{
  if (this->Buf.size() != CM_PROCESS_BUF_SIZE) {
    this->Buf.resize(CM_PROCESS_BUF_SIZE);
  }

  *buf =
    uv_buf_init(this->Buf.data(), static_cast<unsigned int>(this->Buf.size()));
}